

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  ValidityMask *this_00;
  bool bVar1;
  uint32_t uVar2;
  Allocator *pAVar3;
  InternalException *this_01;
  uint *first_value;
  idx_t r;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  WriteStream *ser;
  string_t *value;
  string_t target_value_00;
  string_t target_value_01;
  string_t target_value_02;
  string_t target_value_03;
  string_t target_value_04;
  allocator local_59;
  string_t target_value;
  
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState < 10) {
    this_00 = &input_column->validity;
    pdVar4 = input_column->data;
    first_value = &switchD_01e0e75e::switchdataD_02051290;
    switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
    case 0:
      if ((this_00->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
          (unsigned_long *)0x0) {
        TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,false>
                  (input_column,stats,chunk_start,chunk_end,this_00,temp_writer);
        return;
      }
      TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    default:
      goto switchD_01e0e75e_caseD_1;
    case 5:
      if (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0') {
        pdVar5 = pdVar4 + chunk_start * 0x10 + 8;
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar1) {
            target_value.value._0_8_ = *(undefined8 *)(pdVar5 + -8);
            target_value.value.pointer.ptr = (char *)*(undefined8 *)pdVar5;
            target_value_03.value.pointer.ptr = (char *)first_value;
            target_value_03.value._0_8_ = target_value.value.pointer.ptr;
            ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                      ((ParquetBaseStringOperator *)stats,
                       (ColumnWriterStatistics *)target_value.value._0_8_,target_value_03);
            DbpEncoder::BeginWrite<duckdb::string_t>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
            *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          pdVar5 = pdVar5 + 0x10;
        }
      }
      pdVar4 = pdVar4 + chunk_start * 0x10 + 8;
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar1) {
          target_value.value._0_8_ = *(undefined8 *)(pdVar4 + -8);
          target_value.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
          target_value_04.value.pointer.ptr = (char *)first_value;
          target_value_04.value._0_8_ = target_value.value.pointer.ptr;
          ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                    ((ParquetBaseStringOperator *)stats,
                     (ColumnWriterStatistics *)target_value.value._0_8_,target_value_04);
          DbpEncoder::WriteValue<duckdb::string_t>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,&target_value);
        }
        pdVar4 = pdVar4 + 0x10;
      }
      break;
    case 6:
      if (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0') {
        pdVar5 = pdVar4 + chunk_start * 0x10 + 8;
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar1) {
            target_value.value._0_8_ = *(undefined8 *)(pdVar5 + -8);
            target_value.value.pointer.ptr = (char *)*(undefined8 *)pdVar5;
            target_value_01.value.pointer.ptr = (char *)first_value;
            target_value_01.value._0_8_ = target_value.value.pointer.ptr;
            ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                      ((ParquetBaseStringOperator *)stats,
                       (ColumnWriterStatistics *)target_value.value._0_8_,target_value_01);
            pAVar3 = BufferAllocator::Get
                               (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                                context);
            first_value = (uint *)&target_value;
            DlbaEncoder::BeginWrite<duckdb::string_t>
                      ((DlbaEncoder *)(page_state_p + 0x909),pAVar3,temp_writer,
                       (string_t *)first_value);
            *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
            chunk_start = chunk_start + 1;
            break;
          }
          pdVar5 = pdVar5 + 0x10;
        }
      }
      pdVar4 = pdVar4 + chunk_start * 0x10 + 8;
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar1) {
          target_value.value._0_8_ = *(undefined8 *)(pdVar4 + -8);
          target_value.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
          target_value_02.value.pointer.ptr = (char *)first_value;
          target_value_02.value._0_8_ = target_value.value.pointer.ptr;
          ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                    ((ParquetBaseStringOperator *)stats,
                     (ColumnWriterStatistics *)target_value.value._0_8_,target_value_02);
          DlbaEncoder::WriteValue<duckdb::string_t>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,&target_value);
        }
        pdVar4 = pdVar4 + 0x10;
      }
      break;
    case 8:
      if (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0') {
        for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
          if (bVar1) {
            target_value.value.pointer.length._0_1_ =
                 *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
            (**temp_writer->_vptr_WriteStream)(temp_writer,&target_value,1);
            page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
            *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
            break;
          }
        }
      }
      value = (string_t *)(pdVar4 + chunk_start * 0x10);
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar1) {
          uVar2 = PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
                  ::GetIndex((PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
                              *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
          target_value.value.pointer.length = uVar2;
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&target_value);
        }
        value = value + 1;
      }
      break;
    case 9:
      if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
        pAVar3 = BufferAllocator::Get
                           (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context
                           );
        BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
        *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
      }
      pdVar4 = pdVar4 + chunk_start * 0x10 + 8;
      for (; chunk_start < chunk_end; chunk_start = chunk_start + 1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,chunk_start);
        if (bVar1) {
          target_value.value._0_8_ = *(undefined8 *)(pdVar4 + -8);
          target_value.value.pointer.ptr = (char *)*(undefined8 *)pdVar4;
          target_value_00.value.pointer.ptr = (char *)first_value;
          target_value_00.value._0_8_ = target_value.value.pointer.ptr;
          ParquetBaseStringOperator::HandleStats<duckdb::string_t,duckdb::string_t>
                    ((ParquetBaseStringOperator *)stats,
                     (ColumnWriterStatistics *)target_value.value._0_8_,target_value_00);
          BssEncoder::WriteValue<duckdb::string_t>
                    ((BssEncoder *)(page_state_p + 0x1215),&target_value);
        }
        pdVar4 = pdVar4 + 0x10;
      }
    }
    return;
  }
switchD_01e0e75e_caseD_1:
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&target_value,"Unknown encoding",&local_59);
  InternalException::InternalException(this_01,(string *)&target_value);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}